

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

SharedExNdPtr __thiscall
front::syntax::SyntaxAnalyze::computeIndex(SyntaxAnalyze *this,SharedSyPtr *arr,SharedExNdPtr *node)

{
  element_type *peVar1;
  undefined8 *puVar2;
  long lVar3;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ExpressNode *pEVar5;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  irGenerator *this_00;
  ulong __n;
  SharedExNdPtr SVar6;
  SharedExNdPtr byteIndex;
  SharedExNdPtr index;
  SharedExNdPtr mulNode;
  SharedExNdPtr index2;
  SharedExNdPtr addNode;
  string tmpOff;
  RightVal rightvalue2;
  RightVal rightvalue1;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_310;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_300;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_2e0;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_2d0;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_2c0;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_2b0;
  string tmpPtr;
  string local_280;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)&rightvalue1);
  lVar3 = CONCAT44(rightvalue1.
                   super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                   super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                   super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                   super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                   super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u.
                   _4_4_,rightvalue1.
                         super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         _M_u._M_first._M_storage);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&rightvalue1.
                     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_> + 8))
  ;
  tmpPtr._M_dataplus._M_p = (pointer)&tmpPtr.field_2;
  tmpPtr._M_string_length = 0;
  tmpPtr.field_2._M_local_buf[0] = '\0';
  tmpOff._M_dataplus._M_p = (pointer)&tmpOff.field_2;
  tmpOff._M_string_length = 0;
  tmpOff.field_2._M_local_buf[0] = '\0';
  rightvalue1.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first._M_storage
       = (_Uninitialized<int,_true>)0;
  rightvalue2.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first._M_storage
       = (_Uninitialized<int,_true>)0;
  rightvalue1.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
  rightvalue2.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
             &((in_RCX->_M_ptr->_children).
               super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = (irGenerator *)(arr + 8);
  __n = 1;
  while( true ) {
    if ((ulong)(*(long *)(lVar3 + 0x50) - *(long *)(lVar3 + 0x48) >> 4) <= __n) break;
    p_Var4 = &std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::at((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    *)(lVar3 + 0x48),__n)->
              super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&byteIndex.
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,p_Var4);
    pEVar5 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(pEVar5);
    std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<front::express::ExpressNode,void>
              ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&mulNode,
               pEVar5);
    pEVar5 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(pEVar5);
    std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<front::express::ExpressNode,void>
              ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&addNode,
               pEVar5);
    pEVar5 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(pEVar5);
    std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<front::express::ExpressNode,void>
              ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&index2,
               pEVar5);
    peVar1 = in_RCX->_M_ptr;
    if (__n < (ulong)((long)(peVar1->_children).
                            super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(peVar1->_children).
                            super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      p_Var4 = &std::
                vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                ::at(&peVar1->_children,__n)->
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                 ,p_Var4);
    }
    else {
      (index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = CNS;
      (index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _operation = NUMBER;
      (index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _value = 0;
    }
    (mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _operation = MUL;
    if (((index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->_type == CNS) &&
       ((byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_type == CNS)) {
      (mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = CNS;
      (mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _value = (byteIndex.
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->_value *
               (index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_value;
    }
    else {
      if (tmpOff._M_string_length == 0) {
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_280,this_00,Int);
        std::__cxx11::string::operator=((string *)&tmpOff,(string *)&local_280);
        std::__cxx11::string::~string((string *)&local_280);
      }
      (mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = VAR;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(mulNode.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name);
      if ((index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_type == CNS) {
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,int,std::__cxx11::string> *)&rightvalue1,
                   &(index.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_value);
      }
      else {
        std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                  ((variant<int,int,std::__cxx11::string> *)&rightvalue1,
                   &(index.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
      }
      if ((byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_type == CNS) {
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,int,std::__cxx11::string> *)&rightvalue2,
                   &(byteIndex.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_value);
      }
      else {
        std::variant<int,int,std::__cxx11::string>::operator=
                  ((variant<int,int,std::__cxx11::string> *)&rightvalue2,
                   &(byteIndex.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
      }
      std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
      _Variant_storage<1ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,std::__cxx11::string> *)&local_a8,&tmpOff);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_d0,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&rightvalue1);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_58,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&rightvalue2);
      irGenerator::irGenerator::ir_op
                (this_00,(LeftVal *)&local_a8,(RightVal *)&local_d0,(RightVal *)&local_58,Mul);
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_58);
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_d0);
      std::__detail::__variant::
      _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_a8);
    }
    peVar1 = mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2b0,
               &index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    express::ExpressNode::addChild(peVar1,(SharedExNdPtr *)&local_2b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0._M_refcount);
    peVar1 = mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2c0,
               &byteIndex.
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    express::ExpressNode::addChild(peVar1,(SharedExNdPtr *)&local_2c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
    (addNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _operation = PLUS;
    if (((mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->_type == CNS) &&
       ((index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_type == CNS)) {
      (addNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = CNS;
      (addNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _value = (index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_value +
               (mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_value;
    }
    else {
      if (tmpOff._M_string_length == 0) {
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_280,this_00,Int);
        std::__cxx11::string::operator=((string *)&tmpOff,(string *)&local_280);
        std::__cxx11::string::~string((string *)&local_280);
      }
      (addNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = VAR;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(addNode.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name);
      if ((mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_type == CNS) {
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,int,std::__cxx11::string> *)&rightvalue1,
                   &(mulNode.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_value);
      }
      else {
        std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                  ((variant<int,int,std::__cxx11::string> *)&rightvalue1,
                   &(mulNode.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
      }
      if ((index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_type == CNS) {
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,int,std::__cxx11::string> *)&rightvalue2,
                   &(index2.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_value);
      }
      else {
        std::variant<int,int,std::__cxx11::string>::operator=
                  ((variant<int,int,std::__cxx11::string> *)&rightvalue2,
                   &(index2.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
      }
      std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
      _Variant_storage<1ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,std::__cxx11::string> *)&local_f8,&tmpOff);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_120,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&rightvalue1);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_80,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&rightvalue2);
      irGenerator::irGenerator::ir_op
                (this_00,(LeftVal *)&local_f8,(RightVal *)&local_120,(RightVal *)&local_80,Add);
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_80);
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_120);
      std::__detail::__variant::
      _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_f8);
    }
    peVar1 = addNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2d0,
               &mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)
    ;
    express::ExpressNode::addChild(peVar1,(SharedExNdPtr *)&local_2d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0._M_refcount);
    peVar1 = addNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2e0,
               &index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    express::ExpressNode::addChild(peVar1,(SharedExNdPtr *)&local_2e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e0._M_refcount);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
               &addNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&index2.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&addNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mulNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&byteIndex.
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __n = __n + 1;
  }
  pEVar5 = (ExpressNode *)operator_new(0x48);
  express::ExpressNode::ExpressNode(pEVar5);
  std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<front::express::ExpressNode,void>
            ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&byteIndex,
             pEVar5);
  (byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _operation = MUL;
  if ((index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type == CNS) {
    (byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _type = CNS;
    (byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _value = (index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_value << 2;
  }
  else {
    if (tmpOff._M_string_length == 0) {
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_280,this_00,Int);
      std::__cxx11::string::operator=((string *)&tmpOff,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
    }
    (byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _type = VAR;
    std::__cxx11::string::_M_assign
              ((string *)
               &(byteIndex.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->_name);
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)&rightvalue1,
               &(index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int_const&>
              ((variant<int,int,std::__cxx11::string> *)&rightvalue2,&mir::types::INT_SIZE);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_148,&tmpOff);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_170,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&rightvalue1);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_198,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&rightvalue2);
    irGenerator::irGenerator::ir_op
              (this_00,(LeftVal *)&local_148,(RightVal *)&local_170,(RightVal *)&local_198,Mul);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_198);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_170);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_148);
  }
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2f0,
             &index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
  express::ExpressNode::addChild
            (byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(SharedExNdPtr *)&local_2f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f0._M_refcount);
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
             &byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pEVar5 = (ExpressNode *)operator_new(0x48);
  express::ExpressNode::ExpressNode(pEVar5);
  std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<front::express::ExpressNode,void>
            ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)this,pEVar5);
  irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_280,this_00,Ptr);
  std::__cxx11::string::operator=((string *)&tmpPtr,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  puVar2 = *(undefined8 **)this;
  *puVar2 = 0x600000001;
  std::__cxx11::string::_M_assign((string *)(puVar2 + 2));
  pEVar5 = *(ExpressNode **)this;
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_300,in_RCX);
  express::ExpressNode::addChild(pEVar5,(SharedExNdPtr *)&local_300);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_300._M_refcount);
  pEVar5 = *(ExpressNode **)this;
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_310,
             &index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
  express::ExpressNode::addChild(pEVar5,(SharedExNdPtr *)&local_310);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_310._M_refcount);
  if (in_RCX->_M_ptr->_operation == ARR) {
    __rhs = &tmpPtr;
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_1c0,__rhs);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_1e8,&in_RCX->_M_ptr->_name
              );
    irGenerator::irGenerator::ir_ref(this_00,(LeftVal *)&local_1c0,(LeftVal *)&local_1e8,false);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_1e8);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_1c0);
  }
  else {
    __rhs = &in_RCX->_M_ptr->_name;
  }
  std::variant<int,int,std::__cxx11::string>::operator=
            ((variant<int,int,std::__cxx11::string> *)&rightvalue1,__rhs);
  if ((index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type == CNS) {
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,int,std::__cxx11::string> *)&rightvalue2,
               &(index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_value);
  }
  else {
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)&rightvalue2,
               &(index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name);
  }
  std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
  _Variant_storage<1ul,std::__cxx11::string&>
            ((_Variant_storage<false,int,std::__cxx11::string> *)&local_210,&tmpPtr);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_238,
                    (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&rightvalue1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_260,
                    (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&rightvalue2);
  irGenerator::irGenerator::ir_op
            (this_00,(LeftVal *)&local_210,(RightVal *)&local_238,(RightVal *)&local_260,Add);
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_260);
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_238);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&byteIndex.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&rightvalue2);
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&rightvalue1);
  std::__cxx11::string::~string((string *)&tmpOff);
  std::__cxx11::string::~string((string *)&tmpPtr);
  SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::computeIndex(SharedSyPtr arr, SharedExNdPtr node) {
  vector<SharedExNdPtr> &dimesions =
      std::static_pointer_cast<ArraySymbol>(arr)->_dimensions;
  string tmpPtr;
  string tmpOff;
  RightVal rightvalue1;
  RightVal rightvalue2;
  SharedExNdPtr index = node->_children.front();
  size_t i;

  // in function, there should be a virtual d in dimensions.at(0)
  for (i = 1; i < dimesions.size(); i++) {
    SharedExNdPtr d = dimesions.at(i);

    SharedExNdPtr mulNode = SharedExNdPtr(new ExpressNode());
    SharedExNdPtr addNode = SharedExNdPtr(new ExpressNode());
    SharedExNdPtr index2 = SharedExNdPtr(new ExpressNode());

    if (i < node->_children.size()) {
      index2 = node->_children.at(i);
    } else {
      index2->_type = NodeType::CNS;
      index2->_operation = OperationType::NUMBER;
      index2->_value = 0;
    }

    mulNode->_operation = OperationType::MUL;
    if (index->_type == NodeType::CNS && d->_type == NodeType::CNS) {
      mulNode->_type = NodeType::CNS;
      mulNode->_value = index->_value * d->_value;
    } else {
      if (tmpOff.empty()) {
        tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
      }

      mulNode->_type = NodeType::VAR;
      mulNode->_name = tmpOff;
      if (index->_type == NodeType::CNS) {
        rightvalue1.emplace<0>(index->_value);
      } else {
        rightvalue1.emplace<2>(index->_name);
      }
      if (d->_type == NodeType::CNS) {
        rightvalue2.emplace<0>(d->_value);
      } else {
        rightvalue2 = d->_name;
      }
      irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Mul);
    }
    mulNode->addChild(index);
    mulNode->addChild(d);

    addNode->_operation = OperationType::PLUS;
    if (mulNode->_type == NodeType::CNS && index2->_type == NodeType::CNS) {
      addNode->_type = NodeType::CNS;
      addNode->_value = mulNode->_value + index2->_value;
    } else {
      if (tmpOff.empty()) {
        tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
      }

      addNode->_type = NodeType::VAR;
      addNode->_name = tmpOff;
      if (mulNode->_type == NodeType::CNS) {
        rightvalue1.emplace<0>(mulNode->_value);
      } else {
        rightvalue1.emplace<2>(mulNode->_name);
      }
      if (index2->_type == NodeType::CNS) {
        rightvalue2.emplace<0>(index2->_value);
      } else {
        rightvalue2 = index2->_name;
      }
      irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Add);
    }
    addNode->addChild(mulNode);
    addNode->addChild(index2);

    index = addNode;
  }

  SharedExNdPtr byteIndex = SharedExNdPtr(new ExpressNode());
  byteIndex->_operation = OperationType::MUL;
  if (index->_type == NodeType::CNS) {
    byteIndex->_type = NodeType::CNS;
    byteIndex->_value = index->_value * mir::types::INT_SIZE;
  } else {
    if (tmpOff.empty()) {
      tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
    }

    byteIndex->_type = NodeType::VAR;
    byteIndex->_name = tmpOff;

    rightvalue1 = index->_name;
    rightvalue2.emplace<0>(mir::types::INT_SIZE);

    irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Mul);
  }
  byteIndex->addChild(index);
  index = byteIndex;

  SharedExNdPtr addr = SharedExNdPtr(new ExpressNode());
  tmpPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);

  addr->_type = NodeType::VAR;
  addr->_operation = OperationType::PTR;
  addr->_name = tmpPtr;
  addr->addChild(node);
  addr->addChild(index);

  if (node->_operation == OperationType::ARR) {
    irGenerator.ir_ref(tmpPtr, node->_name);
    rightvalue1 = tmpPtr;
  } else {
    rightvalue1 = node->_name;
  }
  if (index->_type == NodeType::CNS) {
    rightvalue2.emplace<0>(index->_value);
  } else {
    rightvalue2 = index->_name;
  }
  irGenerator.ir_op(tmpPtr, rightvalue1, rightvalue2, Op::Add);

  return addr;
}